

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.h
# Opt level: O3

TightBoundingBox * __thiscall
bezier::Bezier<3UL>::tbb(TightBoundingBox *__return_storage_ptr__,Bezier<3UL> *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Bezier<3UL> bezier;
  Bezier<3UL> local_98;
  ExtremePoints local_50;
  undefined1 local_38 [16];
  Vec2 local_28;
  
  dVar3 = (this->mControlPoints)._M_elems[3].x;
  dVar4 = (this->mControlPoints)._M_elems[3].y;
  local_98.mControlPoints._M_elems[3].x = dVar3;
  local_98.mControlPoints._M_elems[3].y = dVar4;
  local_98.mControlPoints._M_elems[2].x = (this->mControlPoints)._M_elems[2].x;
  local_98.mControlPoints._M_elems[2].y = (this->mControlPoints)._M_elems[2].y;
  local_98.mControlPoints._M_elems[1].x = (this->mControlPoints)._M_elems[1].x;
  local_98.mControlPoints._M_elems[1].y = (this->mControlPoints)._M_elems[1].y;
  local_98.mControlPoints._M_elems[0].x = (this->mControlPoints)._M_elems[0].x;
  local_98.mControlPoints._M_elems[0].y = (this->mControlPoints)._M_elems[0].y;
  local_28.y._0_4_ = SUB84(dVar4,0);
  local_28.x = -dVar3;
  local_28.y._4_4_ = (uint)((ulong)dVar4 >> 0x20) ^ 0x80000000;
  lVar7 = 0;
  do {
    dVar1 = *(double *)((long)&local_98.mControlPoints._M_elems[0].y + lVar7);
    dVar5 = *(double *)((long)&local_98.mControlPoints._M_elems[1].x + lVar7);
    dVar6 = *(double *)((long)&local_98.mControlPoints._M_elems[1].y + lVar7);
    *(double *)((long)&local_98.mControlPoints._M_elems[0].x + lVar7) =
         *(double *)((long)&local_98.mControlPoints._M_elems[0].x + lVar7) - dVar3;
    *(double *)((long)&local_98.mControlPoints._M_elems[0].y + lVar7) = dVar1 - dVar4;
    *(double *)((long)&local_98.mControlPoints._M_elems[1].x + lVar7) = dVar5 - dVar3;
    *(double *)((long)&local_98.mControlPoints._M_elems[1].y + lVar7) = dVar6 - dVar4;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0x40);
  dVar3 = atan2(local_98.mControlPoints._M_elems[0].y,local_98.mControlPoints._M_elems[0].x);
  dVar3 = -dVar3;
  lVar7 = 0;
  do {
    dVar4 = sin(dVar3);
    local_38._8_4_ = extraout_XMM0_Dc;
    local_38._0_8_ = dVar4;
    local_38._12_4_ = extraout_XMM0_Dd;
    dVar5 = cos(dVar3);
    dVar4 = *(double *)((long)&local_98.mControlPoints._M_elems[0].x + lVar7);
    dVar1 = *(double *)((long)&local_98.mControlPoints._M_elems[0].y + lVar7);
    dVar6 = (double)local_38._0_8_ * dVar4 + dVar1 * dVar5 + 0.0;
    auVar2._8_4_ = SUB84(dVar6,0);
    auVar2._0_8_ = dVar5 * dVar4 + -dVar1 * (double)local_38._0_8_ + 0.0;
    auVar2._12_4_ = (int)((ulong)dVar6 >> 0x20);
    *(undefined1 (*) [16])((long)&local_98.mControlPoints._M_elems[0].x + lVar7) = auVar2;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x40);
  extremePoints(&local_50,&local_98);
  TightBoundingBox::TightBoundingBox(__return_storage_ptr__,&local_50,&local_28,dVar3);
  if (local_50.points.super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.points.super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.points.
                          super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.points.
                          super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

TightBoundingBox tbb() const
        {
            Bezier<N> bezier = *this;

            // Translate last control point (highest order) to origo.
            Vec2 translation(-bezier[N]);
            bezier.translate(translation);

            // Rotate bezier to align the first control point (lowest order) with the x-axis
            double angle = -bezier[0].angle();
            bezier.rotate(angle);

            return TightBoundingBox(bezier.extremePoints(), translation, angle);
        }